

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O1

void __thiscall
QOpenGL2PaintEngineExPrivate::updateClipScissorTest(QOpenGL2PaintEngineExPrivate *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  QRect QVar11;
  long lVar12;
  int iVar13;
  undefined8 uVar14;
  uint uVar15;
  undefined8 uVar16;
  long in_FS_OFFSET;
  QRect local_38;
  QRect local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = *(long *)&this->field_0x10;
  lVar12 = *(long *)(lVar7 + 8) + -8;
  if (*(long *)(lVar7 + 8) == 0) {
    lVar12 = 0;
  }
  if ((*(byte *)(lVar12 + 0x1c0) & 4) == 0) {
    (**(code **)(*(long *)&this->funcs + 0x70))();
    lVar12 = *(long *)&this->funcs;
    uVar16 = 0x207;
    uVar15 = 0;
    uVar14 = 0xff;
  }
  else {
    (**(code **)(*(long *)&this->funcs + 0x88))(0xb90);
    lVar12 = *(long *)(lVar7 + 8) + -8;
    if (*(long *)(lVar7 + 8) == 0) {
      lVar12 = 0;
    }
    uVar15 = *(uint *)(lVar12 + 0x1c0) >> 9 & 0xff;
    lVar12 = *(long *)&this->funcs;
    uVar16 = 0x203;
    uVar14 = 0xffffff7f;
  }
  (**(code **)(lVar12 + 0x128))(uVar16,uVar15,uVar14);
  QVar11.x2.m_i = local_38.x2.m_i;
  QVar11.y2.m_i = local_38.y2.m_i;
  QVar11.x1.m_i = local_38.x1.m_i;
  QVar11.y1.m_i = local_38.y1.m_i;
  lVar12 = *(long *)(lVar7 + 8) + -8;
  if (*(long *)(lVar7 + 8) == 0) {
    lVar12 = 0;
  }
  local_28._0_8_ = *(undefined8 *)(lVar12 + 0x1c4);
  local_28._8_8_ = *(undefined8 *)(lVar12 + 0x1cc);
  lVar12 = *(long *)(lVar7 + 8) + -8;
  if (*(long *)(lVar7 + 8) == 0) {
    lVar12 = 0;
  }
  if ((*(byte *)(lVar12 + 0x1a0) & 4) == 0) {
    if (this->useSystemClip == false) {
      uVar1 = this->width;
      uVar4 = this->height;
      auVar9._4_4_ = uVar4 + -1;
      auVar9._0_4_ = uVar1 + -1;
      auVar9._8_8_ = 0;
      local_28 = (QRect)(auVar9 << 0x40);
      local_38 = QVar11;
    }
    else {
      local_28 = (QRect)QRegion::boundingRect();
    }
  }
  else {
    if (this->useSystemClip == false) {
      uVar2 = this->width;
      uVar5 = this->height;
      auVar10._4_4_ = uVar5 + -1;
      auVar10._0_4_ = uVar2 + -1;
      auVar10._8_8_ = 0;
      local_38 = (QRect)(auVar10 << 0x40);
    }
    else {
      local_38 = (QRect)QRegion::boundingRect();
    }
    local_28 = (QRect)QRect::operator&(&local_28,&local_38);
  }
  this->currentScissorBounds = local_28;
  uVar3 = this->width;
  uVar6 = this->height;
  auVar8._4_4_ = -(uint)(local_28.y1.m_i == 0);
  auVar8._0_4_ = -(uint)(local_28.x1.m_i == 0);
  auVar8._8_4_ = -(uint)(uVar3 + -1 == local_28.x2.m_i);
  auVar8._12_4_ = -(uint)(uVar6 + -1 == local_28.y2.m_i);
  iVar13 = movmskps((int)lVar12,auVar8);
  if (iVar13 == 0xf) {
    (**(code **)(*(long *)&this->funcs + 0x70))(0xc11);
  }
  else {
    (**(code **)(*(long *)&this->funcs + 0x88))();
    setScissor(this,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGL2PaintEngineExPrivate::updateClipScissorTest()
{
    Q_Q(QOpenGL2PaintEngineEx);
    if (q->state()->clipTestEnabled) {
#ifndef QT_NO_DEBUG
        if (ctx->format().stencilBufferSize() <= 0)
            qWarning("OpenGL paint engine: attempted to use stencil test for clipping without requesting a stencil buffer.");
#endif
        funcs.glEnable(GL_STENCIL_TEST);
        funcs.glStencilFunc(GL_LEQUAL, q->state()->currentClip, ~GL_STENCIL_HIGH_BIT);
    } else {
        funcs.glDisable(GL_STENCIL_TEST);
        funcs.glStencilFunc(GL_ALWAYS, 0, 0xff);
    }

#ifdef QT_GL_NO_SCISSOR_TEST
    currentScissorBounds = QRect(0, 0, width, height);
#else
    QRect bounds = q->state()->rectangleClip;
    if (!q->state()->clipEnabled) {
        if (useSystemClip)
            bounds = systemClip.boundingRect();
        else
            bounds = QRect(0, 0, width, height);
    } else {
        if (useSystemClip)
            bounds = bounds.intersected(systemClip.boundingRect());
        else
            bounds = bounds.intersected(QRect(0, 0, width, height));
    }

    currentScissorBounds = bounds;

    if (bounds == QRect(0, 0, width, height)) {
        funcs.glDisable(GL_SCISSOR_TEST);
    } else {
        funcs.glEnable(GL_SCISSOR_TEST);
        setScissor(bounds);
    }
#endif
}